

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O2

int __thiscall
soplex::
SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  type_conflict5 tVar4;
  uint uVar5;
  uint uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  result.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 8);
  result.m_backend.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thetolerance.m_backend.data._M_elems;
  result.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 2);
  result.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 4);
  result.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 6);
  result.m_backend.exp =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.exp;
  result.m_backend.neg =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.neg;
  result.m_backend.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  result.m_backend.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
    result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
  }
  uVar6 = (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->thecovectors->set).thenum;
  uVar5 = 0xffffffff;
  while (0 < (int)uVar6) {
    uVar6 = uVar6 - 1;
    pnVar2 = (((this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver)->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = *(undefined8 *)((long)&pnVar2[uVar6].m_backend.data + 0x20);
    local_68.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
    local_68.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[uVar6].m_backend.data;
    local_68.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar2[uVar6].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar2[uVar6].m_backend.data + 0x10);
    local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_68.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
    local_68.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_68.m_backend.exp = pnVar2[uVar6].m_backend.exp;
    local_68.m_backend.neg = pnVar2[uVar6].m_backend.neg;
    local_68.m_backend.fpclass = pnVar2[uVar6].m_backend.fpclass;
    local_68.m_backend.prec_elem = pnVar2[uVar6].m_backend.prec_elem;
    tVar4 = boost::multiprecision::operator<(&local_68,&result);
    if (tVar4) {
      pnVar2 = (((this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&pnVar2[uVar6].m_backend.data + 0x20);
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[uVar6].m_backend.data;
      result.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar2[uVar6].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar2[uVar6].m_backend.data + 0x10);
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      result.m_backend.exp = pnVar2[uVar6].m_backend.exp;
      result.m_backend.neg = pnVar2[uVar6].m_backend.neg;
      result.m_backend.fpclass = pnVar2[uVar6].m_backend.fpclass;
      result.m_backend.prec_elem = pnVar2[uVar6].m_backend.prec_elem;
      uVar5 = uVar6;
    }
  }
  return uVar5;
}

Assistant:

int SPxParMultPR<R>::selectLeave()
{
   int i, n;
   R x;
   R best = -this->thetolerance;
   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   assert(this->thesolver != nullptr);
   n = -1;

   for(i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = this->thesolver->fTest()[i];

      // x *= EQ_PREF * (1 + (up[i] == low[i]));
      if(x < best)
      {
         n = i;
         best = this->thesolver->fTest()[i];
      }
   }

   return n;
}